

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

void __thiscall soplex::SLUFactor<double>::assign(SLUFactor<double> *this,SLUFactor<double> *old)

{
  uint uVar1;
  bool bVar2;
  Timer *pTVar3;
  double *pdVar4;
  long *plVar5;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  Dring **unaff_retaddr;
  int memsize;
  Dring *ring_1;
  Dring *oring_1;
  Dring *ring;
  Dring *oring;
  vector<double,_std::allocator<double>_> *in_stack_00000058;
  vector<double,_std::allocator<double>_> *in_stack_00000060;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  vector<double,_std::allocator<double>_> *local_28;
  undefined8 in_stack_ffffffffffffffe0;
  TYPE ttype;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffe8;
  long lVar6;
  int n;
  
  ttype = (TYPE)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  *(pointer *)(in_RDI + 8) =
       (in_RSI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
       ._M_finish;
  lVar6 = in_RDI;
  (**(code **)((long)*in_RSI[0x25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 0x28))();
  n = (int)((ulong)lVar6 >> 0x20);
  pTVar3 = TimerFactory::createTimer(ttype);
  *(Timer **)(in_RDI + 0x388) = pTVar3;
  (**(code **)((long)*in_RSI[0x13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish + 0x28))();
  pTVar3 = TimerFactory::createTimer(ttype);
  *(Timer **)(in_RDI + 0x1d0) = pTVar3;
  *(undefined4 *)(in_RDI + 0x2cc) =
       *(undefined4 *)
        ((long)&in_RSI[0x1d].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 4);
  *(pointer *)(in_RDI + 0x378) =
       in_RSI[0x25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(in_RDI + 0x380) =
       in_RSI[0x25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(in_RDI + 0x370) =
       in_RSI[0x24].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  *(undefined4 *)(in_RDI + 0x10) =
       *(undefined4 *)
        &(in_RSI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  *(undefined4 *)(in_RDI + 0x14) =
       *(undefined4 *)
        ((long)&(in_RSI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage + 4);
  *(undefined4 *)(in_RDI + 0x18) =
       *(undefined4 *)
        &in_RSI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
  *(pointer *)(in_RDI + 0x20) =
       in_RSI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  *(pointer *)(in_RDI + 0x28) =
       in_RSI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage;
  *(pointer *)(in_RDI + 0x30) =
       in_RSI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start;
  *(pointer *)(in_RDI + 0x38) =
       in_RSI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  *(pointer *)(in_RDI + 0x40) =
       in_RSI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage;
  spx_alloc<int*>((int **)unaff_retaddr,n);
  spx_alloc<int*>((int **)unaff_retaddr,n);
  spx_alloc<int*>((int **)unaff_retaddr,n);
  spx_alloc<int*>((int **)unaff_retaddr,n);
  std::vector<double,_std::allocator<double>_>::reserve(in_RSI,(size_type)in_stack_ffffffffffffffe8)
  ;
  memcpy(*(void **)(in_RDI + 0x50),
         in_RSI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish,(ulong)*(uint *)(in_RDI + 0x14) << 2);
  memcpy(*(void **)(in_RDI + 0x48),
         in_RSI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start,(ulong)*(uint *)(in_RDI + 0x14) << 2);
  memcpy(*(void **)(in_RDI + 0x60),
         in_RSI[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start,(ulong)*(uint *)(in_RDI + 0x14) << 2);
  memcpy(*(void **)(in_RDI + 0x58),
         in_RSI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage,(ulong)*(uint *)(in_RDI + 0x14) << 2);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000060,in_stack_00000058);
  pdVar4 = VectorBase<double>::get_ptr((VectorBase<double> *)0x263156);
  *(double **)(in_RDI + 0x1c8) = pdVar4;
  *(undefined4 *)(in_RDI + 0x128) =
       *(undefined4 *)
        &in_RSI[0xc].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
  *(undefined4 *)(in_RDI + 300) =
       *(undefined4 *)
        ((long)&in_RSI[0xc].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 4);
  spx_alloc<soplex::CLUFactor<double>::Dring*>(unaff_retaddr,n);
  std::vector<double,_std::allocator<double>_>::reserve(in_RSI,(size_type)in_stack_ffffffffffffffe8)
  ;
  spx_alloc<int*>((int **)unaff_retaddr,n);
  spx_alloc<int*>((int **)unaff_retaddr,n);
  spx_alloc<int*>((int **)unaff_retaddr,n);
  spx_alloc<int*>((int **)unaff_retaddr,n);
  memcpy(*(void **)(in_RDI + 0x120),
         in_RSI[0xc].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start,(ulong)*(uint *)(in_RDI + 0x14) * 0x18);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000060,in_stack_00000058);
  memcpy(*(void **)(in_RDI + 0x148),
         in_RSI[0xd].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage,(ulong)*(uint *)(in_RDI + 0x128) << 2);
  memcpy(*(void **)(in_RDI + 0x150),
         in_RSI[0xe].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start,(ulong)(*(int *)(in_RDI + 0x14) + 1) << 2);
  memcpy(*(void **)(in_RDI + 0x158),
         in_RSI[0xe].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish,(ulong)(*(int *)(in_RDI + 0x14) + 1) << 2);
  memcpy(*(void **)(in_RDI + 0x160),
         in_RSI[0xe].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage,(ulong)(*(int *)(in_RDI + 0x14) + 1) << 2);
  if ((0 < *(int *)(in_RDI + 0x14)) && (*(int *)(in_RDI + 0x10) == 0)) {
    *(undefined4 *)(in_RDI + 0x118) =
         *(undefined4 *)
          &in_RSI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
    in_stack_ffffffffffffffe8 = in_RSI + 0xb;
    plVar5 = (long *)(in_RDI + 0x108);
    while ((vector<double,_std::allocator<double>_> *)
           (in_stack_ffffffffffffffe8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start != in_RSI + 0xb) {
      *plVar5 = *(long *)(in_RDI + 0x120) +
                (long)*(int *)((in_stack_ffffffffffffffe8->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_start + 2) * 0x18;
      *(long **)(*plVar5 + 8) = plVar5;
      in_stack_ffffffffffffffe8 =
           (vector<double,_std::allocator<double>_> *)
           (in_stack_ffffffffffffffe8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
      plVar5 = (long *)*plVar5;
    }
    *plVar5 = in_RDI + 0x108;
    *(long **)(*plVar5 + 8) = plVar5;
  }
  *(undefined4 *)(in_RDI + 0x188) =
       *(undefined4 *)
        &in_RSI[0x10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
  *(undefined4 *)(in_RDI + 0x18c) =
       *(undefined4 *)
        ((long)&in_RSI[0x10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 4);
  spx_alloc<soplex::CLUFactor<double>::Dring*>(unaff_retaddr,n);
  spx_alloc<int*>((int **)unaff_retaddr,n);
  spx_alloc<int*>((int **)unaff_retaddr,n);
  spx_alloc<int*>((int **)unaff_retaddr,n);
  spx_alloc<int*>((int **)unaff_retaddr,n);
  bVar2 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffffd0);
  if (bVar2) {
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x2635b2);
  }
  else {
    std::vector<double,_std::allocator<double>_>::reserve
              (in_RSI,(size_type)in_stack_ffffffffffffffe8);
    std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000060,in_stack_00000058);
  }
  memcpy(*(void **)(in_RDI + 0x180),
         in_RSI[0x10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start,(ulong)*(uint *)(in_RDI + 0x14) * 0x18);
  memcpy(*(void **)(in_RDI + 400),
         in_RSI[0x10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage,(ulong)*(uint *)(in_RDI + 0x188) << 2);
  memcpy(*(void **)(in_RDI + 0x1b0),
         in_RSI[0x12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start,(ulong)(*(int *)(in_RDI + 0x14) + 1) << 2);
  memcpy(*(void **)(in_RDI + 0x1b8),
         in_RSI[0x12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish,(ulong)(*(int *)(in_RDI + 0x14) + 1) << 2);
  memcpy(*(void **)(in_RDI + 0x1c0),
         in_RSI[0x12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage,(ulong)(*(int *)(in_RDI + 0x14) + 1) << 2);
  if ((0 < *(int *)(in_RDI + 0x14)) && (*(int *)(in_RDI + 0x10) == 0)) {
    *(undefined4 *)(in_RDI + 0x178) =
         *(undefined4 *)
          &in_RSI[0xf].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
    local_28 = in_RSI + 0xf;
    in_stack_ffffffffffffffd0 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x168);
    while ((vector<double,_std::allocator<double>_> *)
           (local_28->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start != in_RSI + 0xf) {
      (in_stack_ffffffffffffffd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(*(long *)(in_RDI + 0x180) +
                    (long)*(int *)((local_28->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_start + 2) * 0x18);
      (in_stack_ffffffffffffffd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[1] = (double)in_stack_ffffffffffffffd0;
      local_28 = (vector<double,_std::allocator<double>_> *)
                 (local_28->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      in_stack_ffffffffffffffd0 =
           (vector<double,_std::allocator<double>_> *)
           (in_stack_ffffffffffffffd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
    }
    (in_stack_ffffffffffffffd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)(in_RDI + 0x168);
    (in_stack_ffffffffffffffd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start[1] = (double)in_stack_ffffffffffffffd0;
  }
  *(undefined4 *)(in_RDI + 0x68) =
       *(undefined4 *)
        &in_RSI[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
  *(undefined4 *)(in_RDI + 0x90) =
       *(undefined4 *)
        &in_RSI[6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
  *(undefined4 *)(in_RDI + 0x94) =
       *(undefined4 *)
        ((long)&in_RSI[6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + 4);
  *(undefined4 *)(in_RDI + 0x98) =
       *(undefined4 *)
        &in_RSI[6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
  *(undefined4 *)(in_RDI + 0xb0) =
       *(undefined4 *)
        &in_RSI[7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
  std::vector<double,_std::allocator<double>_>::reserve(in_RSI,(size_type)in_stack_ffffffffffffffe8)
  ;
  spx_alloc<int*>((int **)unaff_retaddr,n);
  spx_alloc<int*>((int **)unaff_retaddr,n);
  spx_alloc<int*>((int **)unaff_retaddr,n);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000060,in_stack_00000058);
  memcpy(*(void **)(in_RDI + 0x88),
         in_RSI[5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage,(ulong)*(uint *)(in_RDI + 0x68) << 2);
  memcpy(*(void **)(in_RDI + 0xa0),
         in_RSI[6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage,(ulong)*(uint *)(in_RDI + 0x90) << 2);
  memcpy(*(void **)(in_RDI + 0xa8),
         in_RSI[7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start,(ulong)*(uint *)(in_RDI + 0x90) << 2);
  bVar2 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffffd0);
  if (bVar2) {
    *(undefined8 *)(in_RDI + 0xd0) = 0;
    *(undefined8 *)(in_RDI + 0xd8) = 0;
    *(undefined8 *)(in_RDI + 0xe0) = 0;
    *(undefined8 *)(in_RDI + 0xe8) = 0;
  }
  else {
    uVar1 = *(uint *)(*(long *)(in_RDI + 0xa0) + (long)*(int *)(in_RDI + 0x94) * 4);
    std::vector<double,_std::allocator<double>_>::reserve
              (in_RSI,(size_type)in_stack_ffffffffffffffe8);
    spx_alloc<int*>((int **)unaff_retaddr,n);
    spx_alloc<int*>((int **)unaff_retaddr,n);
    spx_alloc<int*>((int **)unaff_retaddr,n);
    spx_alloc<int*>((int **)unaff_retaddr,n);
    std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000060,in_stack_00000058);
    memcpy(*(void **)(in_RDI + 0xd0),
           in_RSI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage,(ulong)uVar1 << 2);
    memcpy(*(void **)(in_RDI + 0xd8),
           in_RSI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start,(ulong)(*(int *)(in_RDI + 0x14) + 1) << 2);
    memcpy(*(void **)(in_RDI + 0xe0),
           in_RSI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish,(ulong)*(uint *)(in_RDI + 0x14) << 2);
    memcpy(*(void **)(in_RDI + 0xe8),
           in_RSI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage,(ulong)*(uint *)(in_RDI + 0x14) << 2);
  }
  return;
}

Assistant:

void SLUFactor<R>::assign(const SLUFactor<R>& old)
{
   this->spxout = old.spxout;

   solveTime = TimerFactory::createTimer(old.solveTime->type());
   this->factorTime = TimerFactory::createTimer(old.factorTime->type());

   // slufactor
   uptype        = old.uptype;
   minThreshold  = old.minThreshold;
   minStability  = old.minStability;
   lastThreshold = old.lastThreshold;

   // clufactor
   this->stat          = old.stat;
   this->thedim        = old.thedim;
   this->nzCnt         = old.nzCnt;
   this->initMaxabs    = old.initMaxabs;
   this->maxabs        = old.maxabs;
   this->rowMemMult    = old.rowMemMult;
   this->colMemMult    = old.colMemMult;
   this->lMemMult      = old.lMemMult;

   spx_alloc(this->row.perm, this->thedim);
   spx_alloc(this->row.orig, this->thedim);
   spx_alloc(this->col.perm, this->thedim);
   spx_alloc(this->col.orig, this->thedim);
   // spx_alloc(this->diag,     this->thedim);
   this->diag.reserve(this->thedim); // small performance improvement before copying

   memcpy(this->row.perm, old.row.perm, (unsigned int)this->thedim * sizeof(*this->row.perm));
   memcpy(this->row.orig, old.row.orig, (unsigned int)this->thedim * sizeof(*this->row.orig));
   memcpy(this->col.perm, old.col.perm, (unsigned int)this->thedim * sizeof(*this->col.perm));
   memcpy(this->col.orig, old.col.orig, (unsigned int)this->thedim * sizeof(*this->col.orig));

   this->diag = old.diag;

   this->work = vec.get_ptr();

   /* setup U
    */
   this->u.row.size = old.u.row.size;
   this->u.row.used = old.u.row.used;

   spx_alloc(this->u.row.elem,  this->thedim);
   this->u.row.val.reserve(this->u.row.size); // small performance improvement
   spx_alloc(this->u.row.idx,   this->u.row.size);
   spx_alloc(this->u.row.start, this->thedim + 1);
   spx_alloc(this->u.row.len,   this->thedim + 1);
   spx_alloc(this->u.row.max,   this->thedim + 1);

   memcpy(this->u.row.elem,  old.u.row.elem,
          (unsigned int)this->thedim       * sizeof(*this->u.row.elem));
   this->u.row.val = old.u.row.val;
   memcpy(this->u.row.idx,   old.u.row.idx,
          (unsigned int)this->u.row.size   * sizeof(*this->u.row.idx));
   memcpy(this->u.row.start, old.u.row.start,
          (unsigned int)(this->thedim + 1) * sizeof(*this->u.row.start));
   memcpy(this->u.row.len,   old.u.row.len,
          (unsigned int)(this->thedim + 1) * sizeof(*this->u.row.len));
   memcpy(this->u.row.max,   old.u.row.max,
          (unsigned int)(this->thedim + 1) * sizeof(*this->u.row.max));

   // need to make row list ok ?
   if(this->thedim > 0 && this->stat == this->OK)
   {
      this->u.row.list.idx = old.u.row.list.idx; // .idx neu

      const typename CLUFactor<R>::Dring* oring = &old.u.row.list;
      typename CLUFactor<R>::Dring*       ring  = &this->u.row.list;

      while(oring->next != &old.u.row.list)
      {
         ring->next       = &this->u.row.elem[oring->next->idx];
         ring->next->prev = ring;
         oring            = oring->next;
         ring             = ring->next;
      }

      ring->next       = &this->u.row.list;
      ring->next->prev = ring;
   }

   this->u.col.size = old.u.col.size;
   this->u.col.used = old.u.col.used;

   spx_alloc(this->u.col.elem,  this->thedim);
   spx_alloc(this->u.col.idx,   this->u.col.size);
   spx_alloc(this->u.col.start, this->thedim + 1);
   spx_alloc(this->u.col.len,   this->thedim + 1);
   spx_alloc(this->u.col.max,   this->thedim + 1);

   if(!old.u.col.val.empty())
   {
      this->u.col.val.reserve(this->u.col.size); // small performance improvement before copying
      this->u.col.val = old.u.col.val;
   }
   else
   {
      this->u.col.val.clear();
   }

   memcpy(this->u.col.elem,  old.u.col.elem,
          (unsigned int)this->thedim       * sizeof(*this->u.col.elem));
   memcpy(this->u.col.idx,   old.u.col.idx,
          (unsigned int)this->u.col.size   * sizeof(*this->u.col.idx));
   memcpy(this->u.col.start, old.u.col.start,
          (unsigned int)(this->thedim + 1) * sizeof(*this->u.col.start));
   memcpy(this->u.col.len,   old.u.col.len,
          (unsigned int)(this->thedim + 1) * sizeof(*this->u.col.len));
   memcpy(this->u.col.max,   old.u.col.max,
          (unsigned int)(this->thedim + 1) * sizeof(*this->u.col.max));

   // need to make col list ok
   if(this->thedim > 0 && this->stat == this->OK)
   {
      this->u.col.list.idx = old.u.col.list.idx; // .idx neu

      const typename CLUFactor<R>::Dring* oring = &old.u.col.list;
      typename CLUFactor<R>::Dring*       ring  = &this->u.col.list;

      while(oring->next != &old.u.col.list)
      {
         ring->next       = &this->u.col.elem[oring->next->idx];
         ring->next->prev = ring;
         oring            = oring->next;
         ring             = ring->next;
      }

      ring->next       = &this->u.col.list;
      ring->next->prev = ring;
   }

   /* Setup L
    */
   this->l.size        = old.l.size;
   this->l.startSize   = old.l.startSize;
   this->l.firstUpdate = old.l.firstUpdate;
   this->l.firstUnused = old.l.firstUnused;
   this->l.updateType  = old.l.updateType;

   this->l.val.reserve(this->l.size); // small performance improvement for copying
   spx_alloc(this->l.idx,   this->l.size);
   spx_alloc(this->l.start, this->l.startSize);
   spx_alloc(this->l.row,   this->l.startSize);

   this->l.val = old.l.val;
   memcpy(this->l.idx,   old.l.idx, (unsigned int)this->l.size      * sizeof(*this->l.idx));
   memcpy(this->l.start, old.l.start, (unsigned int)this->l.startSize * sizeof(*this->l.start));
   memcpy(this->l.row,   old.l.row, (unsigned int)this->l.startSize * sizeof(*this->l.row));

   if(!this->l.rval.empty())
   {
      assert(old.l.ridx  != nullptr);
      assert(old.l.rbeg  != nullptr);
      assert(old.l.rorig != nullptr);
      assert(old.l.rperm != nullptr);

      int memsize = this->l.start[this->l.firstUpdate];

      this->l.rval.reserve(memsize); // small performance improvement for copying
      spx_alloc(this->l.ridx,  memsize);
      spx_alloc(this->l.rbeg,  this->thedim + 1);
      spx_alloc(this->l.rorig, this->thedim);
      spx_alloc(this->l.rperm, this->thedim);

      this->l.rval = old.l.rval;
      memcpy(this->l.ridx,  old.l.ridx, (unsigned int)memsize     * sizeof(*this->l.ridx));
      memcpy(this->l.rbeg,  old.l.rbeg, (unsigned int)(this->thedim + 1) * sizeof(*this->l.rbeg));
      memcpy(this->l.rorig, old.l.rorig, (unsigned int)this->thedim      * sizeof(*this->l.rorig));
      memcpy(this->l.rperm, old.l.rperm, (unsigned int)this->thedim      * sizeof(*this->l.rperm));
   }
   else
   {
      assert(old.l.ridx  == nullptr);
      assert(old.l.rbeg  == nullptr);
      assert(old.l.rorig == nullptr);
      assert(old.l.rperm == nullptr);

      this->l.ridx  = nullptr;
      this->l.rbeg  = nullptr;
      this->l.rorig = nullptr;
      this->l.rperm = nullptr;
   }

   assert(this->row.perm != nullptr);
   assert(this->row.orig != nullptr);
   assert(this->col.perm != nullptr);
   assert(this->col.orig != nullptr);

   assert(this->u.row.elem  != nullptr);
   assert(this->u.row.idx   != nullptr);
   assert(this->u.row.start != nullptr);
   assert(this->u.row.len   != nullptr);
   assert(this->u.row.max   != nullptr);

   assert(this->u.col.elem  != nullptr);
   assert(this->u.col.idx   != nullptr);
   assert(this->u.col.start != nullptr);
   assert(this->u.col.len   != nullptr);
   assert(this->u.col.max   != nullptr);

   assert(this->l.idx   != nullptr);
   assert(this->l.start != nullptr);
   assert(this->l.row   != nullptr);

}